

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O1

void authentication_do_work(AUTHENTICATION_HANDLE authentication_handle)

{
  AUTHENTICATION_STATE AVar1;
  IOTHUB_CREDENTIAL_TYPE IVar2;
  int iVar3;
  time_t tVar4;
  uint64_t uVar5;
  ON_AUTHENTICATION_ERROR_CALLBACK UNRECOVERED_JUMPTABLE;
  LOGGER_LOG UNRECOVERED_JUMPTABLE_00;
  ulong uVar6;
  char *pcVar7;
  AUTHENTICATION_STATE previous_state;
  AUTHENTICATION_ERROR_CODE AVar8;
  void *pvVar9;
  char *pcVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
      pcVar7 = "authentication_do_work";
      pcVar10 = "authentication_do_work failed (authentication_handle is NULL)";
      iVar3 = 0x21a;
      goto LAB_00133b84;
    }
  }
  else if (authentication_handle->is_cbs_put_token_in_progress == true) {
    if (authentication_handle->current_sas_token_put_time == -1) {
      UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
        pcVar7 = "verify_cbs_put_token_timeout";
        pcVar10 = 
        "Failed verifying if cbs_put_token has timed out (current_sas_token_put_time is not set)";
        iVar3 = 0x51;
LAB_00133b84:
        (*UNRECOVERED_JUMPTABLE_00)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                   ,pcVar7,iVar3,1,pcVar10);
        return;
      }
    }
    else {
      tVar4 = get_time((time_t *)0x0);
      if (tVar4 == -1) {
        UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
          pcVar7 = "verify_cbs_put_token_timeout";
          pcVar10 = "Failed verifying if cbs_put_token has timed out (get_time failed)";
          iVar3 = 0x5a;
          goto LAB_00133b84;
        }
      }
      else {
        dVar11 = get_difftime(tVar4,authentication_handle->current_sas_token_put_time);
        if (authentication_handle->cbs_request_timeout_secs <=
            (ulong)((long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11)) {
          authentication_handle->is_cbs_put_token_in_progress = false;
          AVar1 = authentication_handle->state;
          if (AVar1 != AUTHENTICATION_STATE_ERROR) {
            authentication_handle->state = AUTHENTICATION_STATE_ERROR;
            if (authentication_handle->on_state_changed_callback !=
                (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
              (*authentication_handle->on_state_changed_callback)
                        (authentication_handle->on_state_changed_callback_context,AVar1,
                         AUTHENTICATION_STATE_ERROR);
            }
          }
          if (authentication_handle->on_error_callback != (ON_AUTHENTICATION_ERROR_CALLBACK)0x0) {
            (*authentication_handle->on_error_callback)
                      (authentication_handle->on_error_callback_context,
                       (uint)authentication_handle->is_sas_token_refresh_in_progress * 2);
          }
          authentication_handle->is_sas_token_refresh_in_progress = false;
        }
      }
    }
  }
  else if (authentication_handle->state == AUTHENTICATION_STATE_STARTING) {
    iVar3 = create_and_put_SAS_token_to_cbs(authentication_handle);
    if (iVar3 != 0) {
      UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE_00)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                   ,"authentication_do_work",0x254,1,
                   "Failed authenticating device \'%s\' using device keys",
                   authentication_handle->device_id);
      }
    }
    if (authentication_handle->is_cbs_put_token_in_progress == false) {
      AVar1 = authentication_handle->state;
      if (AVar1 != AUTHENTICATION_STATE_ERROR) {
        authentication_handle->state = AUTHENTICATION_STATE_ERROR;
        if (authentication_handle->on_state_changed_callback !=
            (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
          (*authentication_handle->on_state_changed_callback)
                    (authentication_handle->on_state_changed_callback_context,AVar1,
                     AUTHENTICATION_STATE_ERROR);
        }
      }
      UNRECOVERED_JUMPTABLE = authentication_handle->on_error_callback;
      if (UNRECOVERED_JUMPTABLE != (ON_AUTHENTICATION_ERROR_CALLBACK)0x0) {
        pvVar9 = authentication_handle->on_error_callback_context;
        AVar8 = AUTHENTICATION_ERROR_AUTH_FAILED;
LAB_00133ac6:
        (*UNRECOVERED_JUMPTABLE)(pvVar9,AVar8);
        return;
      }
    }
  }
  else if (authentication_handle->state == AUTHENTICATION_STATE_STARTED) {
    IVar2 = IoTHubClient_Auth_Get_Credential_Type(authentication_handle->authorization_module);
    if ((IVar2 & ~IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
      if (authentication_handle->current_sas_token_put_time == -1) {
        UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
          pcVar7 = "verify_sas_token_refresh_timeout";
          pcVar10 = 
          "Failed verifying if SAS token refresh timed out (current_sas_token_put_time is not set)";
          iVar3 = 0x73;
          goto LAB_00133b84;
        }
      }
      else {
        uVar5 = IoTHubClient_Auth_Get_SasToken_Expiry(authentication_handle->authorization_module);
        if (uVar5 == 0) {
          UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
            pcVar7 = "verify_sas_token_refresh_timeout";
            pcVar10 = "Failed Getting SasToken Expiry";
            iVar3 = 0x78;
            goto LAB_00133b84;
          }
        }
        else {
          tVar4 = get_time((time_t *)0x0);
          if (tVar4 == -1) {
            UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
              pcVar7 = "verify_sas_token_refresh_timeout";
              pcVar10 = "Failed verifying if SAS token refresh timed out (get_time failed)";
              iVar3 = 0x80;
              goto LAB_00133b84;
            }
          }
          else {
            dVar11 = get_difftime(tVar4,authentication_handle->current_sas_token_put_time);
            uVar6 = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
            auVar12._8_4_ = (int)(uVar6 >> 0x20);
            auVar12._0_8_ = uVar6;
            auVar12._12_4_ = 0x45300000;
            auVar13._8_4_ = (int)(uVar5 >> 0x20);
            auVar13._0_8_ = uVar5;
            auVar13._12_4_ = 0x45300000;
            if (((auVar13._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 0.8 <=
                (auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) {
              authentication_handle->is_sas_token_refresh_in_progress = true;
              iVar3 = create_and_put_SAS_token_to_cbs(authentication_handle);
              if (iVar3 != 0) {
                UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
                  (*UNRECOVERED_JUMPTABLE_00)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                             ,"authentication_do_work",0x242,1,"Failed refreshing SAS token \'%s\'",
                             authentication_handle->device_id);
                }
              }
              if (authentication_handle->is_cbs_put_token_in_progress == false) {
                authentication_handle->is_sas_token_refresh_in_progress = false;
                AVar1 = authentication_handle->state;
                if (AVar1 != AUTHENTICATION_STATE_ERROR) {
                  authentication_handle->state = AUTHENTICATION_STATE_ERROR;
                  if (authentication_handle->on_state_changed_callback !=
                      (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
                    (*authentication_handle->on_state_changed_callback)
                              (authentication_handle->on_state_changed_callback_context,AVar1,
                               AUTHENTICATION_STATE_ERROR);
                  }
                }
                UNRECOVERED_JUMPTABLE = authentication_handle->on_error_callback;
                if (UNRECOVERED_JUMPTABLE != (ON_AUTHENTICATION_ERROR_CALLBACK)0x0) {
                  pvVar9 = authentication_handle->on_error_callback_context;
                  AVar8 = AUTHENTICATION_ERROR_SAS_REFRESH_FAILED;
                  goto LAB_00133ac6;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void authentication_do_work(AUTHENTICATION_HANDLE authentication_handle)
{
    if (authentication_handle == NULL)
    {
        LogError("authentication_do_work failed (authentication_handle is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (instance->is_cbs_put_token_in_progress)
        {

            bool is_timed_out;
            if (verify_cbs_put_token_timeout(instance, &is_timed_out) == RESULT_OK && is_timed_out)
            {
                instance->is_cbs_put_token_in_progress = false;

                update_state(instance, AUTHENTICATION_STATE_ERROR);

                if (instance->is_sas_token_refresh_in_progress)
                {
                    notify_error(instance, AUTHENTICATION_ERROR_SAS_REFRESH_TIMEOUT);
                }
                else
                {
                    notify_error(instance, AUTHENTICATION_ERROR_AUTH_TIMEOUT);
                }

                instance->is_sas_token_refresh_in_progress = false;
            }
        }
        else if (instance->state == AUTHENTICATION_STATE_STARTED)
        {
            IOTHUB_CREDENTIAL_TYPE cred_type = IoTHubClient_Auth_Get_Credential_Type(instance->authorization_module);
            if (cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY || cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)
            {
                bool is_timed_out;
                if (verify_sas_token_refresh_timeout(instance, &is_timed_out) == RESULT_OK && is_timed_out)
                {
                    instance->is_sas_token_refresh_in_progress = true;

                    if (create_and_put_SAS_token_to_cbs(instance) != RESULT_OK)
                    {
                        LogError("Failed refreshing SAS token '%s'", instance->device_id);
                    }

                    if (!instance->is_cbs_put_token_in_progress)
                    {
                        instance->is_sas_token_refresh_in_progress = false;

                        update_state(instance, AUTHENTICATION_STATE_ERROR);

                        notify_error(instance, AUTHENTICATION_ERROR_SAS_REFRESH_FAILED);
                    }
                }
            }
        }
        else if (instance->state == AUTHENTICATION_STATE_STARTING)
        {
            if (create_and_put_SAS_token_to_cbs(instance) != RESULT_OK)
            {
                LogError("Failed authenticating device '%s' using device keys", instance->device_id);
            }

            if (!instance->is_cbs_put_token_in_progress)
            {
                update_state(instance, AUTHENTICATION_STATE_ERROR);

                notify_error(instance, AUTHENTICATION_ERROR_AUTH_FAILED);
            }
        }
        else
        {
            // Nothing to be done.
        }
    }
}